

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  bool bVar1;
  WorkingMode WVar2;
  string *psVar3;
  cmMakefile *pcVar4;
  reference ppcVar5;
  unordered_map<std::__cxx11::string,cmTarget,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>>
  *this_00;
  size_type sVar6;
  cmake *pcVar7;
  ostream *poVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string local_390;
  undefined1 local_370 [8];
  string f;
  char **log;
  char *logs [3];
  undefined1 local_328 [8];
  ostringstream msg;
  allocator<char> local_1a9;
  string local_1a8;
  char local_188 [8];
  char num [100];
  undefined1 local_108 [16];
  GlobalTargetInfo *globalTarget;
  iterator __end2;
  iterator __begin2;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *__range2;
  cmTargetMap *targets;
  cmMakefile *mf;
  iterator __end1;
  iterator __begin1;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *__range1;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmMakefile *local_80;
  cmMakefile *dirMf;
  cmStateDirectory local_50;
  undefined1 local_28 [8];
  cmStateSnapshot snapshot;
  cmGlobalGenerator *this_local;
  
  this->FirstTimeProgress = 0.0;
  snapshot.Position.Position = (PositionType)this;
  ClearGeneratorMembers(this);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_28,this->CMakeInstance);
  cmStateSnapshot::GetDirectory(&local_50,(cmStateSnapshot *)local_28);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource(&local_50,psVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&dirMf,(cmStateSnapshot *)local_28);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&dirMf,psVar3);
  pcVar4 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar4,this,(cmStateSnapshot *)local_28);
  local_80 = pcVar4;
  cmMakefile::SetRecursionDepth(pcVar4,this->RecursionDepth);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&local_80);
  IndexMakefile(this,local_80);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pVar9 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->BinaryDirectories,psVar3);
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_80);
  cmMakefile::EnforceDirectoryLevelRules(local_80);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            *)&__range1);
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)&__range1);
  __end1 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
  mf = (cmMakefile *)std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(&this->Makefiles)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                                     *)&mf), bVar1) {
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&__end1);
    this_00 = (unordered_map<std::__cxx11::string,cmTarget,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>>
               *)cmMakefile::GetTargets_abi_cxx11_(*ppcVar5);
    __end2 = std::
             vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             ::begin((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                      *)&__range1);
    globalTarget = (GlobalTargetInfo *)
                   std::
                   vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   ::end((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                          *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
                                       *)&globalTarget), bVar1) {
      pcVar4 = (cmMakefile *)
               __gnu_cxx::
               __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
               ::operator*(&__end2);
      local_108._8_8_ = pcVar4;
      CreateGlobalTarget((cmGlobalGenerator *)local_108,(GlobalTargetInfo *)this,pcVar4);
      std::
      unordered_map<std::__cxx11::string,cmTarget,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>>
      ::emplace<std::__cxx11::string_const&,cmTarget>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4
                 ,(cmTarget *)local_108);
      cmTarget::~cmTarget((cmTarget *)local_108);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
    operator++(&__end1);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)&__range1);
  sVar6 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
  sprintf(local_188,"%d",sVar6 & 0xffffffff);
  pcVar7 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"CMAKE_NUMBER_OF_MAKEFILES",&local_1a9);
  cmake::AddCacheEntry(pcVar7,&local_1a8,local_188,"number of local generators",4);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  CheckTargetProperties(this);
  WVar2 = cmake::GetWorkingMode(this->CMakeInstance);
  if (WVar2 == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::operator<<((ostream *)local_328,"Configuring incomplete, errors occurred!");
      log = (char **)anon_var_dwarf_299461;
      logs[0] = "CMakeError.log";
      logs[1] = (char *)0x0;
      for (f.field_2._8_8_ = &log; *(long *)f.field_2._8_8_ != 0;
          f.field_2._8_8_ = f.field_2._8_8_ + 8) {
        psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        std::__cxx11::string::string((string *)local_370,(string *)psVar3);
        std::__cxx11::string::operator+=((string *)local_370,"/CMakeFiles");
        std::__cxx11::string::operator+=((string *)local_370,"/");
        std::__cxx11::string::operator+=((string *)local_370,*(char **)f.field_2._8_8_);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_370);
        if (bVar1) {
          poVar8 = std::operator<<((ostream *)local_328,"\nSee also \"");
          poVar8 = std::operator<<(poVar8,(string *)local_370);
          std::operator<<(poVar8,"\".");
        }
        std::__cxx11::string::~string((string *)local_370);
      }
    }
    else {
      std::operator<<((ostream *)local_328,"Configuring done");
    }
    pcVar7 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmake::UpdateProgress(pcVar7,&local_390,-1.0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (cmMakefile* mf : this->Makefiles) {
      auto& targets = mf->GetTargets();
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        targets.emplace(globalTarget.Name,
                        this->CreateGlobalTarget(globalTarget, mf));
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += "/CMakeFiles";
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}